

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_threadpool.cpp
# Opt level: O3

int __thiscall stc_tn_callbackobj::operator()(stc_tn_callbackobj *this,int n)

{
  longlong lVar1;
  Logger *pLVar2;
  id local_18;
  
  local_18._M_thread = pthread_self();
  lVar1 = tid_to_ll(&local_18);
  pLVar2 = Logger::get_instance();
  if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","operator()",0x25);
  }
  if (1 < (int)g_log_level) {
    pLVar2 = Logger::get_instance();
    Logger::write_log(pLVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/threadpool/tests/test_threadpool.cpp"
                      ,"operator()",0x25,LOG_LEVEL_INFO,
                      "[tid:%lld]  hello, stc_tn_callbackobj! ret value will be %d \n",lVar1,
                      (ulong)(uint)this->ret_val);
    pLVar2 = Logger::get_instance();
    Logger::flush(pLVar2);
  }
  return this->ret_val;
}

Assistant:

int operator()(int n) {
        long long tid = tid_to_ll(this_thread::get_id());
        LOG_INFO("[tid:%lld]  hello, stc_tn_callbackobj! ret value will be %d \n", tid, ret_val);
		return ret_val;
	}